

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  vw *pvVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  cb_adf *pcVar7;
  _func_int ***__dest;
  option_group_definition *poVar8;
  base_learner *l;
  multi_learner *base;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  long lVar10;
  size_t sVar11;
  undefined **ppuVar12;
  label_parser *plVar13;
  byte bVar14;
  bool bVar15;
  byte bVar16;
  bool cb_adf_option;
  string type_string;
  size_type __dnew_4;
  size_type __dnew;
  option_group_definition new_options;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew_3;
  bool local_6d9;
  size_t local_6d8;
  vw *local_6d0;
  cb_adf *local_6c8;
  int local_6bc;
  bool *local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  _func_int ***local_690;
  _func_int **local_688;
  _func_int **local_680 [2];
  long local_670;
  undefined1 local_668 [112];
  bool local_5f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d0;
  _func_int ***local_5c8;
  _func_int **local_5c0;
  _func_int **local_5b8 [2];
  _func_int ***local_5a8;
  _func_int **local_5a0;
  _func_int **local_598 [2];
  string local_588;
  string local_568;
  option_group_definition local_548;
  undefined1 local_510 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  long *local_470;
  long local_468;
  long local_460 [2];
  _func_int ***local_450;
  _func_int **local_448;
  _func_int **local_440 [2];
  string local_430;
  string local_410;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [112];
  bool local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  bVar16 = 0;
  pcVar7 = calloc_or_throw<CB_ADF::cb_adf>(1);
  memset(pcVar7,0,0x108);
  local_6d9 = false;
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  local_6b0.field_2._M_allocated_capacity._0_4_ = 0x737069;
  local_6b0._M_string_length = 3;
  local_668._0_8_ = (_func_int **)0x30;
  local_6c8 = pcVar7;
  local_690 = local_680;
  local_690 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_690,(ulong)local_668);
  local_680[0] = (_func_int **)local_668._0_8_;
  local_690[4] = (_func_int **)0x20746e65646e6570;
  local_690[5] = (_func_int **)0x7365727574616546;
  local_690[2] = (_func_int **)0x4120687469772074;
  local_690[3] = (_func_int **)0x6544206e6f697463;
  *(undefined4 *)local_690 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_690 + 4),"extu",4);
  *(undefined4 *)(local_690 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_690 + 0xc),"andi",4);
  local_688 = (_func_int **)local_668._0_8_;
  *(char *)((long)local_690 + local_668._0_8_) = '\0';
  local_548.m_name._M_dataplus._M_p = (pointer)&local_548.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_548,local_690,(char *)(local_668._0_8_ + (long)local_690));
  local_548.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_690 != local_680) {
    operator_delete(local_690);
  }
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568.field_2._M_allocated_capacity._0_4_ = 0x615f6263;
  local_568.field_2._M_allocated_capacity._4_2_ = 0x6664;
  local_568._M_string_length = 6;
  local_568.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_668,&local_568,&local_6d9);
  local_5f8 = true;
  local_5a8 = local_598;
  local_3f0._0_8_ = (_func_int **)0x47;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5a8,(ulong)local_3f0);
  uVar4 = local_3f0._0_8_;
  local_598[0] = (_func_int **)local_3f0._0_8_;
  local_5a8 = __dest;
  memcpy(__dest,"Do Contextual Bandit learning with multiline action dependent features.",0x47);
  local_5a0 = (_func_int **)uVar4;
  *(undefined1 *)((long)__dest + uVar4) = 0;
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_668);
  local_6d0 = all;
  poVar8 = VW::config::option_group_definition::add<bool>(&local_548,&local_d0);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  local_588.field_2._M_allocated_capacity = 0x6c6c615f6b6e6172;
  local_588._M_string_length = 8;
  local_588.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_588,&pcVar7->rank_all);
  local_380 = true;
  local_5c8 = local_5b8;
  local_510._0_8_ = (_func_int **)0x24;
  local_5c8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5c8,(ulong)local_510);
  local_5b8[0] = (_func_int **)local_510._0_8_;
  local_5c8[2] = (_func_int **)0x796220646574726f;
  local_5c8[3] = (_func_int **)0x6f2065726f637320;
  *local_5c8 = (_func_int **)0x61206e7275746552;
  local_5c8[1] = (_func_int **)0x7320736e6f697463;
  *(undefined4 *)(local_5c8 + 4) = 0x72656472;
  local_5c0 = (_func_int **)local_510._0_8_;
  *(char *)((long)local_5c8 + local_510._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_3f0);
  local_6b8 = &pcVar7->rank_all;
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_170);
  local_410.field_2._M_allocated_capacity = 0x69646572705f6f6e;
  local_410.field_2._8_2_ = 0x7463;
  local_410._M_string_length = 10;
  local_410.field_2._M_local_buf[10] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_510,&local_410,&pcVar7->no_predict);
  local_350._0_8_ = (_func_int **)0x24;
  local_450 = local_440;
  local_450 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_450,(ulong)local_350);
  local_440[0] = (_func_int **)local_350._0_8_;
  local_450[2] = (_func_int **)0x77206e6f69746369;
  local_450[3] = (_func_int **)0x69617274206e6568;
  *local_450 = (_func_int **)0x6420746f6e206f44;
  local_450[1] = (_func_int **)0x646572702061206f;
  *(undefined4 *)(local_450 + 4) = 0x676e696e;
  local_448 = (_func_int **)local_350._0_8_;
  *(char *)((long)local_450 + local_350._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_510 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_510);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_210);
  local_430.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_430.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_430._M_string_length = 7;
  local_430.field_2._M_local_buf[7] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350,&local_430,&local_6b0);
  local_2e0 = true;
  local_670 = 0x33;
  local_470 = local_460;
  local_470 = (long *)std::__cxx11::string::_M_create((ulong *)&local_470,(ulong)&local_670);
  local_460[0] = local_670;
  local_470[4] = 0x2c7370697b206e69;
  local_470[5] = 0x6d202c72642c6d64;
  local_470[2] = 0x646f6874656d2074;
  local_470[3] = 0x20657375206f7420;
  *local_470 = 0x75747865746e6f63;
  local_470[1] = 0x69646e6162206c61;
  builtin_strncpy((char *)((long)local_470 + 0x2f),"mtr}",4);
  local_468 = local_670;
  *(char *)((long)local_470 + local_670) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar8,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_2b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_470 != local_460) {
    operator_delete(local_470);
  }
  local_350._0_8_ = &PTR__typed_option_002d4190;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  pcVar7 = local_6c8;
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_450 != local_440) {
    operator_delete(local_450);
  }
  local_510._0_8_ = &PTR__typed_option_002d4128;
  if (local_478._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
  }
  if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_510);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_5c8 != local_5b8) {
    operator_delete(local_5c8);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d4128;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_5a8 != local_598) {
    operator_delete(local_5a8);
  }
  local_668._0_8_ = &PTR__typed_option_002d4128;
  if (local_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d0._M_pi);
  }
  if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_668);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_548);
  if (local_6d9 == false) {
    plVar9 = (learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0024f5f0;
  }
  pp_Var2 = (_func_int **)(local_668 + 0x10);
  local_668._16_4_ = 0x745f6263;
  local_668[0x14] = 0x79;
  local_668._21_2_ = 0x6570;
  local_668._8_8_ = (pointer)0x7;
  local_668[0x17] = 0;
  local_668._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options,local_668);
  if ((_func_int **)local_668._0_8_ != pp_Var2) {
    operator_delete((void *)local_668._0_8_);
  }
  pcVar7 = local_6c8;
  if ((char)iVar5 == '\0') {
    local_668._16_4_ = 0x745f6263;
    local_668[0x14] = 0x79;
    local_668._21_2_ = 0x6570;
    local_668._8_8_ = (pointer)0x7;
    local_668[0x17] = 0;
    local_668._0_8_ = pp_Var2;
    (*options->_vptr_options_i[5])(options,local_668,&local_6b0);
    if ((_func_int **)local_668._0_8_ != pp_Var2) {
      operator_delete((void *)local_668._0_8_);
    }
    (**options->_vptr_options_i)(options,&local_548);
  }
  pcVar7->all = local_6d0;
  local_6bc = std::__cxx11::string::compare((char *)&local_6b0);
  if (local_6bc == 0) {
    local_6d8 = 2;
    sVar11 = 0;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_6b0);
    sVar11 = 2;
    if (iVar5 == 0) {
      local_6d8 = 1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_6b0);
      if (iVar5 == 0) {
        local_6d8 = 1;
        sVar11 = 3;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_6b0);
        if (iVar5 == 0) {
          local_6d8 = 1;
          sVar11 = 1;
        }
        else {
          local_6d8 = 1;
          pvVar1 = &local_6d0->trace_message;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pvVar1->super_ostream,
                     "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\'}; resetting to ips."
                     ,0x46);
          std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
          std::ostream::put((char)pvVar1);
          std::ostream::flush();
        }
      }
    }
  }
  (pcVar7->gen_cs).cb_type = sVar11;
  local_6d0->delete_prediction = ACTION_SCORE::delete_action_scores;
  local_668._16_4_ = 0x616f7363;
  local_668[0x14] = 0x61;
  local_668._21_2_ = 0x6c5f;
  local_668[0x17] = 100;
  local_668[0x18] = 'f';
  local_668[0x19] = '\0';
  local_668._8_8_ = (pointer)0x9;
  local_668._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((char)iVar5 == '\0') {
    local_3f0._0_8_ = local_3f0 + 0x10;
    local_3f0._16_4_ = 0x5f706177;
    local_3f0._20_3_ = 0x66646c;
    local_3f0._8_8_ = (pointer)0x7;
    local_3f0[0x17] = 0;
    iVar6 = (*options->_vptr_options_i[1])(options,local_3f0);
    bVar14 = 1;
    if (((char)iVar6 != '\0') && (*local_6b8 == false)) goto LAB_0024f266;
LAB_0024f2c0:
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_);
    }
  }
  else {
    bVar14 = 1;
    if (*local_6b8 == false) {
LAB_0024f266:
      local_510._16_8_ = 0x61725f61616f7363;
      local_510._24_2_ = 0x6b6e;
      local_510._8_8_ = (pointer)0xa;
      local_510[0x1a] = '\0';
      local_510._0_8_ = local_510 + 0x10;
      iVar6 = (*options->_vptr_options_i[1])(options,local_510);
      if ((undefined1 *)local_510._0_8_ != local_510 + 0x10) {
        operator_delete((void *)local_510._0_8_);
      }
      bVar14 = (byte)iVar6 ^ 1;
      if ((char)iVar5 == '\0') goto LAB_0024f2c0;
    }
  }
  if ((_func_int **)local_668._0_8_ != pp_Var2) {
    operator_delete((void *)local_668._0_8_);
  }
  if (bVar14 != 0) {
    local_668._16_4_ = 0x616f7363;
    local_668[0x14] = 0x61;
    local_668._21_2_ = 0x6c5f;
    local_668[0x17] = 100;
    local_668[0x18] = 'f';
    local_668[0x19] = '\0';
    local_668._8_8_ = (pointer)0x9;
    local_668._0_8_ = pp_Var2;
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_668._0_8_ != pp_Var2) {
      operator_delete((void *)local_668._0_8_);
    }
    if ((char)iVar5 == '\0') {
      local_668._16_4_ = 0x616f7363;
      local_668[0x14] = 0x61;
      local_668._21_2_ = 0x6c5f;
      local_668[0x17] = 100;
      local_668[0x18] = 'f';
      local_668[0x19] = '\0';
      local_668._8_8_ = (pointer)0x9;
      local_510._16_8_ = 0x6e696c69746c756d;
      local_510._24_2_ = 0x65;
      local_510._8_8_ = (pointer)0x9;
      local_668._0_8_ = pp_Var2;
      local_510._0_8_ = local_510 + 0x10;
      (*options->_vptr_options_i[5])(options,local_668,local_510);
      if ((undefined1 *)local_510._0_8_ != local_510 + 0x10) {
        operator_delete((void *)local_510._0_8_);
      }
      if ((_func_int **)local_668._0_8_ != pp_Var2) {
        operator_delete((void *)local_668._0_8_);
      }
    }
    local_668._16_4_ = 0x616f7363;
    local_668[0x14] = 0x61;
    local_668._21_2_ = 0x725f;
    local_668[0x17] = 0x61;
    local_668[0x18] = 'n';
    local_668[0x19] = 'k';
    local_668._8_8_ = (pointer)0xa;
    local_668[0x1a] = '\0';
    local_668._0_8_ = pp_Var2;
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_668._0_8_ != pp_Var2) {
      operator_delete((void *)local_668._0_8_);
    }
    if ((char)iVar5 == '\0') {
      local_668._16_4_ = 0x616f7363;
      local_668[0x14] = 0x61;
      local_668._21_2_ = 0x725f;
      local_668[0x17] = 0x61;
      local_668[0x18] = 'n';
      local_668[0x19] = 'k';
      local_668._8_8_ = (pointer)0xa;
      local_668[0x1a] = '\0';
      local_510._8_8_ = (pointer)0x0;
      local_510._16_8_ = local_510._16_8_ & 0xffffffffffffff00;
      local_668._0_8_ = pp_Var2;
      local_510._0_8_ = local_510 + 0x10;
      (*options->_vptr_options_i[5])(options,local_668,local_510);
      if ((undefined1 *)local_510._0_8_ != local_510 + 0x10) {
        operator_delete((void *)local_510._0_8_);
      }
      if ((_func_int **)local_668._0_8_ != pp_Var2) {
        operator_delete((void *)local_668._0_8_);
      }
    }
  }
  local_668._16_4_ = 0x65736162;
  local_668[0x14] = 0x6c;
  local_668._21_2_ = 0x6e69;
  local_668[0x17] = 0x65;
  local_668._8_8_ = (pointer)0x8;
  local_668[0x18] = '\0';
  local_668._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options);
  pcVar7 = local_6c8;
  sVar11 = local_6d8;
  bVar15 = local_6bc == 0;
  if ((_func_int **)local_668._0_8_ != pp_Var2) {
    operator_delete((void *)local_668._0_8_);
  }
  if ((bVar15 & (byte)iVar5) != 0) {
    local_668._16_4_ = 0x63656863;
    local_668[0x14] = 0x6b;
    local_668._21_2_ = 0x655f;
    local_668[0x17] = 0x6e;
    local_668[0x18] = 'a';
    local_668[0x19] = 'b';
    local_668[0x1a] = 'l';
    local_668._27_2_ = 0x6465;
    local_668._8_8_ = (pointer)0xd;
    local_668[0x1d] = '\0';
    local_510._8_8_ = (pointer)0x0;
    local_510._16_8_ = local_510._16_8_ & 0xffffffffffffff00;
    local_668._0_8_ = pp_Var2;
    local_510._0_8_ = local_510 + 0x10;
    (*options->_vptr_options_i[5])(options,local_668,local_510);
    if ((undefined1 *)local_510._0_8_ != local_510 + 0x10) {
      operator_delete((void *)local_510._0_8_);
    }
    if ((_func_int **)local_668._0_8_ != pp_Var2) {
      operator_delete((void *)local_668._0_8_);
    }
  }
  pvVar3 = local_6d0;
  l = setup_base(options,local_6d0);
  base = LEARNER::as_multiline<char,char>(l);
  ppuVar12 = &CB::cb_label;
  plVar13 = &pvVar3->p->lp;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    plVar13->default_label = (_func_void_void_ptr *)*ppuVar12;
    ppuVar12 = ppuVar12 + (ulong)bVar16 * -2 + 1;
    plVar13 = (label_parser *)((long)plVar13 + (ulong)bVar16 * -0x10 + 8);
  }
  pvVar3->label_type = cb;
  plVar9 = LEARNER::learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (pcVar7,base,CB_ADF::do_actual_learning<true>,CB_ADF::do_actual_learning<false>
                      ,sVar11,action_scores);
  *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
  *(code **)(plVar9 + 0x68) = CB_ADF::finish_multiline_example;
  (pcVar7->gen_cs).scorer = pvVar3->scorer;
  *(undefined8 *)(plVar9 + 0xb8) = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 200) = CB_ADF::finish;
  *(code **)(plVar9 + 0x80) = CB_ADF::save_load;
  *(undefined8 *)(plVar9 + 0x70) = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
  pcVar7 = (cb_adf *)0x0;
LAB_0024f5f0:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_548.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548.m_name._M_dataplus._M_p != &local_548.m_name.field_2) {
    operator_delete(local_548.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  if (pcVar7 != (cb_adf *)0x0) {
    destroy_free<CB_ADF::cb_adf>(pcVar7);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "ips";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr, mtr}"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm'}; resetting to ips." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}